

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

bool libwebm::vttdemux::ParseHeader(IMkvReader *reader,mkvpos_t *pos)

{
  int iVar1;
  longlong lVar2;
  mkvpos_t status;
  EBMLHeader h;
  mkvpos_t *pos_local;
  IMkvReader *reader_local;
  
  h.m_docTypeReadVersion = (longlong)pos;
  mkvparser::EBMLHeader::EBMLHeader((EBMLHeader *)&status);
  lVar2 = mkvparser::EBMLHeader::Parse
                    ((EBMLHeader *)&status,reader,(longlong *)h.m_docTypeReadVersion);
  if (lVar2 == 0) {
    if (h.m_maxSizeLength != 0) {
      iVar1 = strcmp((char *)h.m_maxSizeLength,"webm");
      if (iVar1 == 0) {
        reader_local._7_1_ = true;
        goto LAB_0011994e;
      }
    }
    printf("bad doctype\n");
    reader_local._7_1_ = false;
  }
  else {
    printf("error parsing EBML header\n");
    reader_local._7_1_ = false;
  }
LAB_0011994e:
  mkvparser::EBMLHeader::~EBMLHeader((EBMLHeader *)&status);
  return reader_local._7_1_;
}

Assistant:

bool vttdemux::ParseHeader(mkvparser::IMkvReader* reader, mkvpos_t* pos) {
  mkvparser::EBMLHeader h;
  const mkvpos_t status = h.Parse(reader, *pos);

  if (status) {
    printf("error parsing EBML header\n");
    return false;
  }

  if (h.m_docType == NULL || strcmp(h.m_docType, "webm") != 0) {
    printf("bad doctype\n");
    return false;
  }

  return true;  // success
}